

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryStream.cpp
# Opt level: O0

Range __thiscall binlog::IstreamEntryStream::nextEntryPayload(IstreamEntryStream *this)

{
  istream *piVar1;
  long lVar2;
  ulong uVar3;
  FILE *__stream;
  runtime_error *this_00;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type size_00;
  IstreamEntryStream *in_RDI;
  uint32_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  uint __val;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  long in_stack_fffffffffffffe98;
  string local_f8 [39];
  undefined1 local_d1;
  string local_40 [36];
  undefined1 local_1c [12];
  Range local_10;
  
  std::istream::read((char *)in_RDI->_input,(long)local_1c);
  lVar2 = std::istream::gcount();
  if (lVar2 == 0) {
    memset(&local_10,0,0x10);
    Range::Range(&local_10);
  }
  else {
    uVar3 = std::ios::operator!((ios *)(in_RDI->_input + *(long *)(*(long *)in_RDI->_input + -0x18))
                               );
    if ((uVar3 & 1) != 0) {
      __stream = (FILE *)std::istream::gcount();
      rewind(in_RDI,__stream);
      local_d1 = 1;
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::istream::gcount();
      std::__cxx11::to_string(in_stack_fffffffffffffe98);
      std::operator+((char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe88);
      std::operator+(in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      std::runtime_error::runtime_error(this_00,local_40);
      local_d1 = 0;
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    piVar1 = in_RDI->_input;
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x11b962);
    std::istream::read((char *)piVar1,(long)pcVar4);
    uVar3 = std::ios::operator!((ios *)(in_RDI->_input + *(long *)(*(long *)in_RDI->_input + -0x18))
                               );
    if ((uVar3 & 1) != 0) {
      lVar2 = std::istream::gcount();
      rewind(in_RDI,(FILE *)(lVar2 + 4));
      __val = (uint)((ulong)in_RDI >> 0x20);
      uVar5 = 1;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::istream::gcount();
      std::__cxx11::to_string(in_stack_fffffffffffffe98);
      std::operator+((char *)__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::to_string(__val);
      std::operator+(in_stack_fffffffffffffe88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar5,in_stack_fffffffffffffe80));
      std::runtime_error::runtime_error((runtime_error *)__rhs,local_f8);
      __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x11bb76);
    size_00 = std::vector<char,_std::allocator<char>_>::size(&in_RDI->_buffer);
    Range::Range(&local_10,pcVar4,size_00);
  }
  return local_10;
}

Assistant:

Range IstreamEntryStream::nextEntryPayload()
{
  std::uint32_t size;
  _input.read(reinterpret_cast<char*>(&size), sizeof(size));
  if (_input.gcount() == 0)
  {
    return {}; // eof
  }

  if (! _input) // found some bytes, but not enough
  {
    rewind(_input.gcount());
    throw std::runtime_error("Failed to read entry size from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(sizeof(size)));
  }

  // TODO(benedek) protect agains bad alloc by limiting size?
  _buffer.resize(size);
  _input.read(_buffer.data(), std::streamsize(size));
  if (! _input) // payload is truncated
  {
    rewind(std::streamsize(sizeof(size)) + _input.gcount());
    throw std::runtime_error("Failed to read entry payload from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(size));
  }

  return Range{_buffer.data(), _buffer.size()};
}